

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setIndex
          (GLShaderProgram *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  bool bVar1;
  invalid_argument *piVar2;
  reference puVar3;
  size_type sVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long in_RDI;
  uint x;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  uint bigThresh;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30 [2];
  uint local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"Tried to setIndex() when program drawMode does not use indexed drawing");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_10 = in_RSI;
  if (((*(byte *)(in_RDI + 0x20) & 1) != 0) && ((*(byte *)(in_RDI + 0x21) & 1) == 0)) {
    local_20 = 99999999;
    local_30[0]._M_current =
         (uint *)geometrycentral::surface::std::vector<unsigned_int,_std::allocator<unsigned_int>_>
                 ::begin(in_stack_ffffffffffffffa8);
    geometrycentral::surface::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              (in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffb0,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(local_30);
      if (local_20 < *puVar3) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar2,
                   "An unusual index was passed, but setPrimitiveRestartIndex() has not been called."
                  );
        __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(local_30);
    }
  }
  sVar4 = geometrycentral::surface::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (local_10);
  *(size_type *)(in_RDI + 0x18) = sVar4;
  return;
}

Assistant:

void GLShaderProgram::setIndex(std::vector<unsigned int>& indices) {
  // (This version is typically used for indexed lines)

  if (!useIndex) {
    throw std::invalid_argument("Tried to setIndex() when program drawMode does not use indexed "
                                "drawing");
  }

  // Catch some cases where we forget to specify the restart index.
  // It would be nice to do a more complete check involving the data buffer, but this is simple
  // and catches most mistakes.
  if (usePrimitiveRestart && !primitiveRestartIndexSet) {
    unsigned int bigThresh = 99999999;
    for (unsigned int x : indices) {
      if (x > bigThresh) {
        throw std::invalid_argument("An unusual index was passed, but setPrimitiveRestartIndex() has not been called.");
      }
    }
  }
  indexSize = indices.size();
}